

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<8,_8192>::CollectUnmarked(ObjectBlockPool<8,_8192> *this)

{
  ulong uVar1;
  FastVector<SmallBlock<8>_*,_false,_false> *this_00;
  SmallBlock<8> *pSVar2;
  SmallBlock<8> *pSVar3;
  uint i;
  ulong uVar4;
  SmallBlock<8> *local_48;
  FastVector<SmallBlock<8>_*,_false,_false> *local_40;
  FastVector<SmallBlock<8>_*,_false,_false> *local_38;
  
  local_38 = &this->objectsToFree;
  local_40 = &this->objectsToFinalize;
  for (pSVar2 = (SmallBlock<8> *)&this->activePages; pSVar2 = (SmallBlock<8> *)pSVar2->marker,
      pSVar2 != (SmallBlock<8> *)0x0; pSVar2 = pSVar2 + 0x2001) {
    uVar4 = 0;
    pSVar3 = pSVar2;
    while( true ) {
      pSVar3 = pSVar3 + 1;
      uVar1 = (ulong)this->lastNum;
      if (pSVar2 != (SmallBlock<8> *)this->activePages) {
        uVar1 = 0x2000;
      }
      if (uVar1 <= uVar4) break;
      if ((pSVar3->marker & 3) == 0) {
        this_00 = local_38;
        if (((uint)pSVar3->marker & 0xc) == 4) {
          this_00 = local_40;
        }
        local_48 = pSVar3;
        FastVector<SmallBlock<8>_*,_false,_false>::push_back(this_00,&local_48);
      }
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}